

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall test_message2_sizes::test_method(test_message2_sizes *this)

{
  unsigned_long size;
  assertion_result local_b0;
  char *local_98;
  char *local_90;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_const_unsigned_long_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  local_88;
  unsigned_long local_78;
  const_string local_70;
  const_string local_60;
  lazy_ostream local_50;
  undefined1 *local_40;
  char **local_38;
  
  local_78 = 0x3a;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b4d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x186924);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x116;
  local_88.m_lhs.m_value = 0x3a;
  local_88.m_rhs = &local_78;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_const_unsigned_long_&,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  ::evaluate(&local_b0,&local_88,false);
  local_98 = "msg.body_size() == size";
  local_90 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b0750;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_60.m_end = "";
  local_38 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_50,&local_60,0x116,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1b4d70,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x186924);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x117;
  local_88.m_lhs.m_value = 0x3f;
  local_88.m_rhs = (unsigned_long *)0x3f;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
  ::evaluate(&local_b0,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<unsigned_int,_unsigned_long,_void>_>
              *)&local_88,false);
  local_98 = "msg.size() == sizeof(message_header) + size";
  local_90 = "";
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b0750;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_70.m_end = "";
  local_38 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_50,&local_70,0x117,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_message2_sizes)
{
    #pragma pack(push, 1)
    struct test_message2 final : public basic_message<test_message2, message_id::UNDEFINED>
    {
        std::uint8_t a;
        std::uint32_t b;
        std::uint8_t c;
        float d;
        std::array<std::uint8_t, 27> e;
        double f;
        std::uint8_t g;
        std::array<std::uint32_t, 3> h;
    };
    #pragma pack(pop)

    const auto size = sizeof(std::uint8_t)
        + sizeof(std::uint32_t)
        + sizeof(std::uint8_t)
        + sizeof(float)
        + sizeof(std::array<std::uint8_t, 27>)
        + sizeof(double)
        + sizeof(std::uint8_t)
        + sizeof(std::array<std::uint32_t, 3>);

    const auto msg = test_message2{};

    BOOST_TEST(msg.body_size() == size);
    BOOST_TEST(msg.size() == sizeof(message_header) + size);
}